

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O0

char * ae_fflagstostr(unsigned_long bitset,unsigned_long bitclear)

{
  char cVar1;
  char *pcVar2;
  size_t sVar3;
  ulong in_RSI;
  ulong in_RDI;
  size_t length;
  flag *flag;
  unsigned_long bits;
  char *sp;
  char *dp;
  char *string;
  size_t local_48;
  flag *local_40;
  ulong local_38;
  char *local_30;
  char *local_28;
  ulong local_18;
  ulong local_10;
  char *local_8;
  
  local_38 = in_RDI | in_RSI;
  local_48 = 0;
  for (local_40 = flags; local_40->name != (char *)0x0; local_40 = local_40 + 1) {
    if ((local_38 & (local_40->set | local_40->clear)) != 0) {
      sVar3 = strlen(local_40->name);
      local_48 = sVar3 + 1 + local_48;
      local_38 = ((local_40->set | local_40->clear) ^ 0xffffffffffffffff) & local_38;
    }
  }
  if (local_48 == 0) {
    local_8 = (char *)0x0;
  }
  else {
    local_8 = (char *)malloc(local_48);
    if (local_8 == (char *)0x0) {
      local_8 = (char *)0x0;
    }
    else {
      local_28 = local_8;
      local_18 = in_RSI;
      local_10 = in_RDI;
      for (local_40 = flags; local_40->name != (char *)0x0; local_40 = local_40 + 1) {
        if (((local_10 & local_40->set) == 0) && ((local_18 & local_40->clear) == 0)) {
          if (((local_10 & local_40->clear) != 0) || ((local_18 & local_40->set) != 0)) {
            local_30 = local_40->name;
            goto LAB_0011775e;
          }
        }
        else {
          local_30 = local_40->name + 2;
LAB_0011775e:
          local_10 = ((local_40->set | local_40->clear) ^ 0xffffffffffffffff) & local_10;
          local_18 = ((local_40->set | local_40->clear) ^ 0xffffffffffffffff) & local_18;
          pcVar2 = local_28;
          if (local_8 < local_28) {
            *local_28 = ',';
            pcVar2 = local_28 + 1;
          }
          do {
            local_28 = pcVar2;
            cVar1 = *local_30;
            *local_28 = cVar1;
            local_30 = local_30 + 1;
            pcVar2 = local_28 + 1;
          } while (cVar1 != '\0');
        }
      }
      *local_28 = '\0';
    }
  }
  return local_8;
}

Assistant:

static char *
ae_fflagstostr(unsigned long bitset, unsigned long bitclear)
{
	char *string, *dp;
	const char *sp;
	unsigned long bits;
	struct flag *flag;
	size_t	length;

	bits = bitset | bitclear;
	length = 0;
	for (flag = flags; flag->name != NULL; flag++)
		if (bits & (flag->set | flag->clear)) {
			length += strlen(flag->name) + 1;
			bits &= ~(flag->set | flag->clear);
		}

	if (length == 0)
		return (NULL);
	string = (char *)malloc(length);
	if (string == NULL)
		return (NULL);

	dp = string;
	for (flag = flags; flag->name != NULL; flag++) {
		if (bitset & flag->set || bitclear & flag->clear) {
			sp = flag->name + 2;
		} else if (bitset & flag->clear  ||  bitclear & flag->set) {
			sp = flag->name;
		} else
			continue;
		bitset &= ~(flag->set | flag->clear);
		bitclear &= ~(flag->set | flag->clear);
		if (dp > string)
			*dp++ = ',';
		while ((*dp++ = *sp++) != '\0')
			;
		dp--;
	}

	*dp = '\0';
	return (string);
}